

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

StringPiece __thiscall
google::protobuf::stringpiece_internal::StringPiece::substr
          (StringPiece *this,size_type pos,size_type n)

{
  size_type sVar1;
  size_type local_30;
  size_type n_local;
  size_type pos_local;
  StringPiece *this_local;
  
  sVar1 = length(this);
  n_local = pos;
  if (sVar1 < pos) {
    n_local = length(this);
  }
  local_30 = n;
  if (this->length_ - n_local < n) {
    local_30 = length(this);
    local_30 = local_30 - n_local;
  }
  StringPiece((StringPiece *)&this_local,this->ptr_ + n_local,local_30);
  return _this_local;
}

Assistant:

StringPiece StringPiece::substr(size_type pos, size_type n) const {
  if (pos > length()) pos = length();
  if (n > length_ - pos) n = length() - pos;
  return StringPiece(ptr_ + pos, n);
}